

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O1

void TTD::NSSnapValues::InflateScriptContext
               (SnapContext *snpCtx,ScriptContext *intoCtx,InflateMap *inflator,
               TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::TopLevelScriptLoadFunctionBodyResolveInfo_*>
               *topLevelLoadScriptMap,
               TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::TopLevelNewFunctionBodyResolveInfo_*>
               *topLevelNewScriptMap,
               TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::TopLevelEvalFunctionBodyResolveInfo_*>
               *topLevelEvalScriptMap)

{
  JavascriptLibrary *pJVar1;
  TopLevelFunctionInContextRelation *pTVar2;
  TopLevelScriptLoadFunctionBodyResolveInfo *fbInfo;
  TopLevelNewFunctionBodyResolveInfo *fbInfo_00;
  TopLevelEvalFunctionBodyResolveInfo *fbInfo_01;
  int iVar3;
  RecyclableData *pRVar4;
  FunctionBody *pFVar5;
  Entry *pEVar6;
  Entry *pEVar7;
  Entry *pEVar8;
  long lVar9;
  ulong uVar10;
  void *unaff_retaddr;
  undefined1 auStack_c8 [8];
  ScriptEntryExitRecord __entryExitRecord;
  EnterScriptObject __enterScriptObject;
  ScriptContext *__localScriptContext;
  
  iVar3 = PAL_wcscmp((snpCtx->ContextSRC).Contents,intoCtx->url);
  if (iVar3 == 0) {
    Js::JavascriptLibrary::SetIsPRNGSeeded
              ((intoCtx->super_ScriptContextBase).javascriptLibrary,snpCtx->IsPNRGSeeded);
    pJVar1 = (intoCtx->super_ScriptContextBase).javascriptLibrary;
    pJVar1->randSeed0 = snpCtx->RandomSeed0;
    pJVar1->randSeed1 = snpCtx->RandomSeed1;
    InflateMap::AddScriptContext(inflator,snpCtx->ScriptContextLogId,intoCtx);
    ScriptContextTTD::ClearLoadedSourcesForSnapshotRestore(intoCtx->TTDContextInfo);
    pRVar4 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                       (&intoCtx->threadContext->recyclableData);
    if ((pRVar4->exceptionObject).ptr != (JavascriptExceptionObject *)0x0) {
      Js::ScriptContext::GetAndClearRecordedException(intoCtx,(bool *)0x0);
    }
    if (snpCtx->LoadedTopLevelScriptCount != 0) {
      lVar9 = 0;
      uVar10 = 0;
      do {
        pTVar2 = snpCtx->LoadedTopLevelScriptArray;
        pFVar5 = InflateMap::FindReusableFunctionBodyIfExists
                           (inflator,*(TTD_PTR_ID *)
                                      ((long)&pTVar2->ContextSpecificBodyPtrId + lVar9));
        pEVar6 = TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::TopLevelScriptLoadFunctionBodyResolveInfo_*>
                 ::FindSlotForId<false>
                           (topLevelLoadScriptMap,
                            (ulong)*(uint *)((long)&pTVar2->TopLevelBodyCtr + lVar9));
        fbInfo = pEVar6->Data;
        if (pFVar5 == (FunctionBody *)0x0) {
          pFVar5 = InflateTopLevelLoadedFunctionBodyInfo(fbInfo,intoCtx);
        }
        else {
          ScriptContextTTD::ProcessFunctionBodyOnLoad
                    (intoCtx->TTDContextInfo,pFVar5,(FunctionBody *)0x0);
          ScriptContextTTD::RegisterLoadedScript
                    (intoCtx->TTDContextInfo,pFVar5,
                     *(uint32 *)((long)&pTVar2->TopLevelBodyCtr + lVar9));
          ExecutionInfoManager::ProcessScriptLoad_InflateReuseBody
                    (intoCtx->threadContext->TTDExecutionInfo,
                     *(uint32 *)((long)&pTVar2->TopLevelBodyCtr + lVar9),pFVar5);
        }
        InflateMap::UpdateFBScopes(inflator,&(fbInfo->TopLevelBase).ScopeChainInfo,pFVar5);
        InflateMap::AddInflationFunctionBody
                  (inflator,*(TTD_PTR_ID *)((long)&pTVar2->ContextSpecificBodyPtrId + lVar9),pFVar5)
        ;
        uVar10 = uVar10 + 1;
        lVar9 = lVar9 + 0x10;
      } while (uVar10 < snpCtx->LoadedTopLevelScriptCount);
    }
    __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
    __entryExitRecord.scriptContext = (ScriptContext *)0x0;
    __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
    __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
    auStack_c8 = (undefined1  [8])0x0;
    __entryExitRecord._0_1_ = 0;
    __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
    __entryExitRecord._2_6_ = 0;
    __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
    Js::EnterScriptObject::EnterScriptObject
              ((EnterScriptObject *)&__entryExitRecord.handledExceptionType,intoCtx,
               (ScriptEntryExitRecord *)auStack_c8,unaff_retaddr,&stack0x00000000,true,true,true);
    Js::ScriptContext::OnScriptStart(intoCtx,true,true);
    Js::EnterScriptObject::VerifyEnterScript
              ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
    if (snpCtx->NewFunctionTopLevelScriptCount != 0) {
      lVar9 = 0;
      uVar10 = 0;
      do {
        pTVar2 = snpCtx->NewFunctionTopLevelScriptArray;
        pFVar5 = InflateMap::FindReusableFunctionBodyIfExists
                           (inflator,*(TTD_PTR_ID *)
                                      ((long)&pTVar2->ContextSpecificBodyPtrId + lVar9));
        pEVar7 = TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::TopLevelNewFunctionBodyResolveInfo_*>
                 ::FindSlotForId<false>
                           (topLevelNewScriptMap,
                            (ulong)*(uint *)((long)&pTVar2->TopLevelBodyCtr + lVar9));
        fbInfo_00 = pEVar7->Data;
        if (pFVar5 == (FunctionBody *)0x0) {
          pFVar5 = InflateTopLevelNewFunctionBodyInfo(fbInfo_00,intoCtx);
        }
        else {
          ScriptContextTTD::ProcessFunctionBodyOnLoad
                    (intoCtx->TTDContextInfo,pFVar5,(FunctionBody *)0x0);
          ScriptContextTTD::RegisterNewScript
                    (intoCtx->TTDContextInfo,pFVar5,
                     *(uint32 *)((long)&pTVar2->TopLevelBodyCtr + lVar9));
          ExecutionInfoManager::ProcessScriptLoad_InflateReuseBody
                    (intoCtx->threadContext->TTDExecutionInfo,
                     *(uint32 *)((long)&pTVar2->TopLevelBodyCtr + lVar9),pFVar5);
        }
        InflateMap::UpdateFBScopes(inflator,&(fbInfo_00->TopLevelBase).ScopeChainInfo,pFVar5);
        InflateMap::AddInflationFunctionBody
                  (inflator,*(TTD_PTR_ID *)((long)&pTVar2->ContextSpecificBodyPtrId + lVar9),pFVar5)
        ;
        uVar10 = uVar10 + 1;
        lVar9 = lVar9 + 0x10;
      } while (uVar10 < snpCtx->NewFunctionTopLevelScriptCount);
    }
    if (snpCtx->EvalTopLevelScriptCount != 0) {
      lVar9 = 0;
      uVar10 = 0;
      do {
        pTVar2 = snpCtx->EvalTopLevelScriptArray;
        pFVar5 = InflateMap::FindReusableFunctionBodyIfExists
                           (inflator,*(TTD_PTR_ID *)
                                      ((long)&pTVar2->ContextSpecificBodyPtrId + lVar9));
        pEVar8 = TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::TopLevelEvalFunctionBodyResolveInfo_*>
                 ::FindSlotForId<false>
                           (topLevelEvalScriptMap,
                            (ulong)*(uint *)((long)&pTVar2->TopLevelBodyCtr + lVar9));
        fbInfo_01 = pEVar8->Data;
        if (pFVar5 == (FunctionBody *)0x0) {
          pFVar5 = InflateTopLevelEvalFunctionBodyInfo(fbInfo_01,intoCtx);
        }
        else {
          ScriptContextTTD::ProcessFunctionBodyOnLoad
                    (intoCtx->TTDContextInfo,pFVar5,(FunctionBody *)0x0);
          ScriptContextTTD::RegisterEvalScript
                    (intoCtx->TTDContextInfo,pFVar5,
                     *(uint32 *)((long)&pTVar2->TopLevelBodyCtr + lVar9));
          ExecutionInfoManager::ProcessScriptLoad_InflateReuseBody
                    (intoCtx->threadContext->TTDExecutionInfo,
                     *(uint32 *)((long)&pTVar2->TopLevelBodyCtr + lVar9),pFVar5);
        }
        InflateMap::UpdateFBScopes(inflator,&(fbInfo_01->TopLevelBase).ScopeChainInfo,pFVar5);
        InflateMap::AddInflationFunctionBody
                  (inflator,*(TTD_PTR_ID *)((long)&pTVar2->ContextSpecificBodyPtrId + lVar9),pFVar5)
        ;
        uVar10 = uVar10 + 1;
        lVar9 = lVar9 + 0x10;
      } while (uVar10 < snpCtx->EvalTopLevelScriptCount);
    }
    Js::EnterScriptObject::~EnterScriptObject
              ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
    return;
  }
  TTDAbort_unrecoverable_error("Make sure the src uri values are the same.");
}

Assistant:

void InflateScriptContext(const SnapContext* snpCtx, Js::ScriptContext* intoCtx, InflateMap* inflator,
            const TTDIdentifierDictionary<uint64, TopLevelScriptLoadFunctionBodyResolveInfo*>& topLevelLoadScriptMap,
            const TTDIdentifierDictionary<uint64, TopLevelNewFunctionBodyResolveInfo*>& topLevelNewScriptMap,
            const TTDIdentifierDictionary<uint64, TopLevelEvalFunctionBodyResolveInfo*>& topLevelEvalScriptMap)
        {
            TTDAssert(wcscmp(snpCtx->ContextSRC.Contents, intoCtx->GetUrl()) == 0, "Make sure the src uri values are the same.");

            intoCtx->GetLibrary()->SetIsPRNGSeeded(snpCtx->IsPNRGSeeded);
            intoCtx->GetLibrary()->SetRandSeed0(snpCtx->RandomSeed0);
            intoCtx->GetLibrary()->SetRandSeed1(snpCtx->RandomSeed1);
            inflator->AddScriptContext(snpCtx->ScriptContextLogId, intoCtx);

            intoCtx->TTDContextInfo->ClearLoadedSourcesForSnapshotRestore();

            if(intoCtx->HasRecordedException())
            {
                intoCtx->GetAndClearRecordedException(nullptr);
            }

            for(uint32 i = 0; i < snpCtx->LoadedTopLevelScriptCount; ++i)
            {
                const TopLevelFunctionInContextRelation& cri = snpCtx->LoadedTopLevelScriptArray[i];

                Js::FunctionBody* fb = inflator->FindReusableFunctionBodyIfExists(cri.ContextSpecificBodyPtrId);
                const TopLevelScriptLoadFunctionBodyResolveInfo* fbInfo = topLevelLoadScriptMap.LookupKnownItem(cri.TopLevelBodyCtr);

                if(fb == nullptr)
                {
                    fb = NSSnapValues::InflateTopLevelLoadedFunctionBodyInfo(fbInfo, intoCtx);
                }
                else
                {
                    intoCtx->TTDContextInfo->ProcessFunctionBodyOnLoad(fb, nullptr);
                    intoCtx->TTDContextInfo->RegisterLoadedScript(fb, cri.TopLevelBodyCtr);

                    intoCtx->GetThreadContext()->TTDExecutionInfo->ProcessScriptLoad_InflateReuseBody(cri.TopLevelBodyCtr, fb);
                }

                inflator->UpdateFBScopes(fbInfo->TopLevelBase.ScopeChainInfo, fb);
                inflator->AddInflationFunctionBody(cri.ContextSpecificBodyPtrId, fb);
            }

            //The inflation code for NewFunction and Eval uses the paths in the runtime (which assume they are in script) -- so enter here to make them happy
            BEGIN_ENTER_SCRIPT(intoCtx, true, true, true)
            {
                for(uint32 i = 0; i < snpCtx->NewFunctionTopLevelScriptCount; ++i)
                {
                    const TopLevelFunctionInContextRelation& cri = snpCtx->NewFunctionTopLevelScriptArray[i];

                    Js::FunctionBody* fb = inflator->FindReusableFunctionBodyIfExists(cri.ContextSpecificBodyPtrId);
                    const TopLevelNewFunctionBodyResolveInfo* fbInfo = topLevelNewScriptMap.LookupKnownItem(cri.TopLevelBodyCtr);

                    if(fb == nullptr)
                    {
                        fb = NSSnapValues::InflateTopLevelNewFunctionBodyInfo(fbInfo, intoCtx);
                    }
                    else
                    {
                        intoCtx->TTDContextInfo->ProcessFunctionBodyOnLoad(fb, nullptr);
                        intoCtx->TTDContextInfo->RegisterNewScript(fb, cri.TopLevelBodyCtr);

                        intoCtx->GetThreadContext()->TTDExecutionInfo->ProcessScriptLoad_InflateReuseBody(cri.TopLevelBodyCtr, fb);
                    }

                    inflator->UpdateFBScopes(fbInfo->TopLevelBase.ScopeChainInfo, fb);
                    inflator->AddInflationFunctionBody(cri.ContextSpecificBodyPtrId, fb);
                }

                for(uint32 i = 0; i < snpCtx->EvalTopLevelScriptCount; ++i)
                {
                    const TopLevelFunctionInContextRelation& cri = snpCtx->EvalTopLevelScriptArray[i];

                    Js::FunctionBody* fb = inflator->FindReusableFunctionBodyIfExists(cri.ContextSpecificBodyPtrId);
                    const TopLevelEvalFunctionBodyResolveInfo* fbInfo = topLevelEvalScriptMap.LookupKnownItem(cri.TopLevelBodyCtr);

                    if(fb == nullptr)
                    {
                        fb = NSSnapValues::InflateTopLevelEvalFunctionBodyInfo(fbInfo, intoCtx);
                    }
                    else
                    {
                        intoCtx->TTDContextInfo->ProcessFunctionBodyOnLoad(fb, nullptr);
                        intoCtx->TTDContextInfo->RegisterEvalScript(fb, cri.TopLevelBodyCtr);

                        intoCtx->GetThreadContext()->TTDExecutionInfo->ProcessScriptLoad_InflateReuseBody(cri.TopLevelBodyCtr, fb);
                    }

                    inflator->UpdateFBScopes(fbInfo->TopLevelBase.ScopeChainInfo, fb);
                    inflator->AddInflationFunctionBody(cri.ContextSpecificBodyPtrId, fb);
                }
            }
            END_ENTER_SCRIPT
        }